

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack3_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  *out = (*in & 7) + base;
  out[1] = (*in >> 3 & 7) + base;
  out[2] = (*in >> 6 & 7) + base;
  out[3] = (*in >> 9 & 7) + base;
  out[4] = (*in >> 0xc & 7) + base;
  out[5] = (*in >> 0xf & 7) + base;
  out[6] = (*in >> 0x12 & 7) + base;
  out[7] = (*in >> 0x15 & 7) + base;
  return in + 1;
}

Assistant:

uint32_t * unpack3_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  15  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  )   % (1U << 3 )  ;
    *out += base;
    out++;

    return in + 1;
}